

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void forbody(LexState *ls,int base,int line,int nvars,int isgen)

{
  FuncState *fs_00;
  int pc;
  int iVar1;
  int endfor;
  int prep;
  FuncState *fs;
  BlockCnt bl;
  int isgen_local;
  int nvars_local;
  int line_local;
  int base_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  bl._16_4_ = isgen;
  bl._20_4_ = nvars;
  checknext(ls,0x102);
  pc = luaK_codeABx(fs_00,forbody::forprep[(int)bl._16_4_],base,0);
  enterblock(fs_00,(BlockCnt *)&fs,'\0');
  adjustlocalvars(ls,bl._20_4_);
  luaK_reserveregs(fs_00,bl._20_4_);
  block(ls);
  leaveblock(fs_00);
  iVar1 = luaK_getlabel(fs_00);
  fixforjump(fs_00,pc,iVar1,0);
  if (bl._16_4_ != 0) {
    luaK_codeABCk(fs_00,OP_TFORCALL,base,0,bl._20_4_,0);
    luaK_fixline(fs_00,line);
  }
  iVar1 = luaK_codeABx(fs_00,forbody::forloop[(int)bl._16_4_],base,0);
  fixforjump(fs_00,iVar1,pc + 1,1);
  luaK_fixline(fs_00,line);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isgen) {
  /* forbody -> DO block */
  static const OpCode forprep[2] = {OP_FORPREP, OP_TFORPREP};
  static const OpCode forloop[2] = {OP_FORLOOP, OP_TFORLOOP};
  BlockCnt bl;
  FuncState *fs = ls->fs;
  int prep, endfor;
  checknext(ls, TK_DO);
  prep = luaK_codeABx(fs, forprep[isgen], base, 0);
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  fixforjump(fs, prep, luaK_getlabel(fs), 0);
  if (isgen) {  /* generic for? */
    luaK_codeABC(fs, OP_TFORCALL, base, 0, nvars);
    luaK_fixline(fs, line);
  }
  endfor = luaK_codeABx(fs, forloop[isgen], base, 0);
  fixforjump(fs, endfor, prep + 1, 1);
  luaK_fixline(fs, line);
}